

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

Type __thiscall wasm::Type::reinterpret(Type *this)

{
  BasicType BVar1;
  Type *this_00;
  Iterator local_18;
  
  if ((this->id & 1) != 0 && 6 < this->id) {
    __assert_fail("!isTuple() && \"Unexpected tuple type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                  ,0x2b5,"Type wasm::Type::reinterpret() const");
  }
  local_18.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
  local_18.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = this;
  this_00 = Iterator::operator*(&local_18);
  BVar1 = getBasic(this_00);
  if (BVar1 - i32 < 4) {
    return (Type)*(uintptr_t *)(&DAT_00e5c570 + (ulong)(BVar1 - i32) * 8);
  }
  handle_unreachable("invalid type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                     ,0x2c0);
}

Assistant:

Type Type::reinterpret() const {
  assert(!isTuple() && "Unexpected tuple type");
  switch ((*begin()).getBasic()) {
    case Type::i32:
      return f32;
    case Type::i64:
      return f64;
    case Type::f32:
      return i32;
    case Type::f64:
      return i64;
    default:
      WASM_UNREACHABLE("invalid type");
  }
}